

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix-face.c
# Opt level: O0

void ndn_unix_face_recv(void *self,size_t param_len,void *param)

{
  uint uVar1;
  int *piVar2;
  ndn_msg *pnVar3;
  uint local_48;
  int ret;
  uint32_t cur_size;
  uint32_t cur_type;
  uint8_t *valptr;
  uint8_t *buf;
  ssize_t size;
  ndn_unix_face_t *ptr;
  void *param_local;
  size_t param_len_local;
  void *self_local;
  
  *(undefined8 *)((long)self + 0x98) = 0;
  size = (ssize_t)self;
  ptr = (ndn_unix_face_t *)param;
  param_local = (void *)param_len;
  param_len_local = (size_t)self;
  buf = (uint8_t *)
        recv(*(int *)((long)self + 0xa0),
             (void *)((long)self + (ulong)*(uint *)((long)self + 0x10a4) + 0xa4),
             0x1000 - (ulong)*(uint *)((long)self + 0x10a4),0);
  if ((long)buf < 1) {
    if ((buf != (uint8_t *)0xffffffffffffffff) || (piVar2 = __errno_location(), *piVar2 != 0xb)) {
      ndn_face_down((ndn_face_intf_t *)size);
      return;
    }
  }
  else {
    printf("Some packets recved\n");
    buf = buf + *(uint *)(size + 0x10a4);
    valptr = (uint8_t *)(size + 0xa4);
    while (((valptr < buf + size + 0xa4 &&
            (_cur_size = tlv_get_type_length(valptr,(size_t)(buf + ((size + 0xa4) - (long)valptr)),
                                             (uint32_t *)&ret,&local_48),
            _cur_size != (uint8_t *)0x0)) &&
           (local_48 = local_48 + ((int)_cur_size - (int)valptr),
           valptr + local_48 <= buf + size + 0xa4))) {
      uVar1 = ndn_forwarder_receive((ndn_face_intf_t *)size,valptr,(ulong)local_48);
      if (uVar1 != 0) {
        printf("forwarder receive fail, error code = %d\n",(ulong)uVar1);
      }
      valptr = valptr + local_48;
    }
    if (valptr < buf + size + 0xa4) {
      memcpy((void *)(size + 0xa4),valptr,(size_t)(buf + ((size + 0xa4) - (long)valptr)));
      *(int *)(size + 0x10a4) = ((int)size + 0xa4 + (int)buf) - (int)valptr;
    }
    else {
      *(undefined4 *)(size + 0x10a4) = 0;
    }
  }
  pnVar3 = ndn_msgqueue_post((void *)param_len_local,ndn_unix_face_recv,(size_t)param_local,ptr);
  *(ndn_msg **)(size + 0x98) = pnVar3;
  return;
}

Assistant:

static void
ndn_unix_face_recv(void *self, size_t param_len, void *param){
  ndn_unix_face_t* ptr = (ndn_unix_face_t*)self;
  ssize_t size;
  uint8_t *buf, *valptr;
  uint32_t cur_type, cur_size;

  // It works without this line but I think adding is better, following the logic.
  // So ndn_face_down won't cancel a not existing event.
  ptr->process_event = NULL;

  size = recv(ptr->sock,
              ptr->buf + ptr->offset,
              sizeof(ptr->buf) - ptr->offset,
              0);
  if(size > 0){
    printf("Some packets recved\n");
    // Some packets recved
    size += ptr->offset;
    for(buf = ptr->buf; buf < ptr->buf + size; buf += cur_size){
      valptr = tlv_get_type_length(buf, ptr->buf + size - buf, &cur_type, &cur_size);
      if(valptr == NULL){
        break;
      }
      cur_size += valptr - buf;
      if(buf + cur_size > ptr->buf + size){
        break;
      }
      int ret = ndn_forwarder_receive(&ptr->intf, buf, cur_size);
      if (ret != NDN_SUCCESS)
          printf("forwarder receive fail, error code = %d\n", ret);
    }
    if(buf < ptr->buf + size){
      // TODO: Too large packets will block the receive.
      memcpy(ptr->buf, buf, ptr->buf + size - buf);
      ptr->offset = ptr->buf + size - buf;
    }else{
      ptr->offset = 0;
    }
  }else if(size == -1 && errno == EWOULDBLOCK){
    // No more packet
  }else{
    // size == 0 means a shutdown
    ndn_face_down(&ptr->intf);
    return;
  }

  ptr->process_event = ndn_msgqueue_post(self, ndn_unix_face_recv, param_len, param);
}